

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall
pfederc::ArrayLitExpr::ArrayLitExpr
          (ArrayLitExpr *this,Lexer *lexer,Position *pos,
          list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *exprs)

{
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *this_00;
  size_t sVar1;
  _List_node_base *p_Var2;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_ARRLIT;
  sVar1 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar1;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ArrayLitExpr_00128a38;
  this_00 = &this->exprs;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)this_00,(_List_node_header *)exprs);
  p_Var2 = (this->exprs).
           super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)this_00) {
    __assert_fail("!this->exprs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x3b6,
                  "pfederc::ArrayLitExpr::ArrayLitExpr(const Lexer &, const Position &, std::list<std::unique_ptr<Expr>> &&)"
                 );
  }
  for (; p_Var2 != (_List_node_base *)this_00; p_Var2 = p_Var2->_M_next) {
    (p_Var2[1]._M_next)->_M_prev = (_List_node_base *)this;
  }
  return;
}

Assistant:

ArrayLitExpr::ArrayLitExpr(const Lexer &lexer, const Position &pos,
     std::list<std::unique_ptr<Expr>> &&exprs) noexcept
     : Expr(lexer, ExprType::EXPR_ARRLIT, pos),
       exprs(std::move(exprs)) {
  assert(!this->exprs.empty());

  _setParents(this->exprs, this);
}